

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O3

FT_Error T1_Size_Init(FT_Size t1size)

{
  code *pcVar1;
  int iVar2;
  FT_Module pFVar3;
  undefined8 *puVar4;
  PSHinter_Service pshinter;
  PSH_Globals globals;
  void *local_20;
  
  puVar4 = *(undefined8 **)&t1size->face[3].units_per_EM;
  pFVar3 = FT_Get_Module((t1size->face->driver->root).library,"pshinter");
  iVar2 = 0;
  if ((puVar4 != (undefined8 *)0x0 && pFVar3 != (FT_Module)0x0) &&
     (pcVar1 = (code *)*puVar4, pcVar1 != (code *)0x0)) {
    puVar4 = (undefined8 *)(*pcVar1)(pFVar3);
    if (puVar4 != (undefined8 *)0x0) {
      iVar2 = (*(code *)*puVar4)(t1size->face->memory,&t1size->face[1].available_sizes,&local_20);
      if (iVar2 == 0) {
        t1size->internal->module_data = local_20;
      }
    }
  }
  return iVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Size_Init( FT_Size  t1size )      /* T1_Size */
  {
    T1_Size            size  = (T1_Size)t1size;
    FT_Error           error = FT_Err_Ok;
    PSH_Globals_Funcs  funcs = T1_Size_Get_Globals_Funcs( size );


    if ( funcs )
    {
      PSH_Globals  globals;
      T1_Face      face = (T1_Face)size->root.face;


      error = funcs->create( size->root.face->memory,
                             &face->type1.private_dict, &globals );
      if ( !error )
        t1size->internal->module_data = globals;
    }

    return error;
  }